

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

void replace_positional(string *fmt,string *from,string *to)

{
  ulong uVar1;
  string *psVar2;
  size_type pos;
  string *to_local;
  string *from_local;
  string *fmt_local;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)fmt,(ulong)from);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)fmt,uVar1,psVar2);
    std::__cxx11::string::length();
  }
  return;
}

Assistant:

static void replace_positional (
  std::string& fmt,
  const std::string& from,
  const std::string& to)
{
  std::string::size_type pos = 0;
  while ((pos = fmt.find (from, pos)) != std::string::npos)
  {
    fmt.replace (pos, from.length (), to);
    pos += to.length ();
  }
}